

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Expression> __thiscall Parser::variable(Parser *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  Identifier ident;
  undefined1 local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Alloc_hider local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  size_type local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_40;
  unsigned_long local_30;
  unsigned_long uStack_28;
  
  local_58._M_p._0_4_ = (in_RSI->currentToken).type;
  pcVar1 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
  _Stack_50._M_pi = &local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_50,pcVar1,pcVar1 + (in_RSI->currentToken).lexeme._M_string_length);
  local_30 = (in_RSI->currentToken).line;
  uStack_28 = (in_RSI->currentToken).col;
  if (_Stack_50._M_pi == &local_40) {
    local_78.field_2._8_4_ = local_40._M_use_count;
    local_78.field_2._12_4_ = local_40._M_weak_count;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78._M_dataplus._M_p = (pointer)_Stack_50._M_pi;
  }
  local_78.field_2._M_allocated_capacity = (size_type)local_40._vptr__Sp_counted_base;
  local_78._M_string_length = local_48;
  consume(in_RSI,Identifier,"identifier");
  local_58._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Symbol,std::allocator<Symbol>,std::__cxx11::string&>
            (&_Stack_50,(Symbol **)&local_58,(allocator<Symbol> *)&local_79,&local_78);
  (this->filepath)._M_dataplus._M_p = local_58._M_p;
  (this->filepath)._M_string_length = (size_type)_Stack_50._M_pi;
  _Var2._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::variable() {
    Identifier ident = token().lexeme;
    consume(TokenType::Identifier, "identifier");
    ptr<Expression> expr = make<Symbol>(ident);
    return expr;
}